

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

int SSL_ech_accepted(SSL *ssl)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = SSL_in_early_data(ssl);
  if ((iVar1 == 0) || ((ssl->field_0xa4 & 1) != 0)) {
    bVar2 = ssl->s3->ech_status == ssl_ech_accepted;
  }
  else {
    bVar2 = (_Head_base<0UL,_bssl::ECHConfig_*,_false>)
            *(_Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter> *)
             &(((ssl->s3->hs)._M_t.
                super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->
              selected_ech_config)._M_t.
              super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter> != (ECHConfig *)0x0;
  }
  return (int)bVar2;
}

Assistant:

int SSL_ech_accepted(const SSL *ssl) {
  if (SSL_in_early_data(ssl) && !ssl->server) {
    // In the client early data state, we report properties as if the server
    // accepted early data. The server can only accept early data with
    // ClientHelloInner.
    return ssl->s3->hs->selected_ech_config != nullptr;
  }

  return ssl->s3->ech_status == ssl_ech_accepted;
}